

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetManifests
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  cmMakefile *this_00;
  cmLocalCommonGenerator *this_01;
  pointer ppcVar1;
  string *psVar2;
  pointer ppcVar3;
  string_view source;
  string_view separator;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  manifests;
  char *local_d0;
  size_t local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string manifestFlag;
  string lang;
  
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetManifests(this->GeneratorTarget,&manifest_srcs,config);
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&manifests,
            (long)manifest_srcs.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)manifest_srcs.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  cmGeneratorTarget::GetLinkerLanguage(&lang,this->GeneratorTarget,config);
  this_00 = this->Makefile;
  std::operator+(&local_b0,"CMAKE_",&lang);
  std::operator+(&local_90,&local_b0,"_LINKER_MANIFEST_FLAG");
  psVar2 = (string *)cmMakefile::GetDefinition(this_00,&local_90);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&manifestFlag,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  ppcVar1 = manifest_srcs.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = manifest_srcs.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1
      ) {
    this_01 = this->LocalCommonGenerator;
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar3);
    (*(this_01->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[2])
              (&local_d0,this_01,psVar2);
    source._M_str = local_d0;
    source._M_len = local_c8;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_b0,(cmOutputConverter *)this_01,source,SHELL,false);
    std::operator+(&local_90,&manifestFlag,&local_b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&manifests,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&manifests,separator,(string_view)ZEXT816(0));
  std::__cxx11::string::~string((string *)&manifestFlag);
  std::__cxx11::string::~string((string *)&lang);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&manifests);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&manifest_srcs.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetManifests(const std::string& config)
{
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, config);

  std::vector<std::string> manifests;
  manifests.reserve(manifest_srcs.size());

  std::string lang = this->GeneratorTarget->GetLinkerLanguage(config);
  std::string manifestFlag =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_LINKER_MANIFEST_FLAG");
  for (cmSourceFile const* manifest_src : manifest_srcs) {
    manifests.push_back(manifestFlag +
                        this->LocalCommonGenerator->ConvertToOutputFormat(
                          this->LocalCommonGenerator->MaybeRelativeToWorkDir(
                            manifest_src->GetFullPath()),
                          cmOutputConverter::SHELL));
  }

  return cmJoin(manifests, " ");
}